

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DistanceGraph.cc
# Opt level: O3

unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_> * __thiscall
DistanceGraph::get_connected_nodes
          (unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>
           *__return_storage_ptr__,DistanceGraph *this)

{
  pointer pvVar1;
  pointer pvVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_> r;
  ulong local_78;
  _Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_70;
  _Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_68;
  
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  pvVar1 = (this->links).
           super__Vector_base<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar2 = (this->links).
           super__Vector_base<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (1 < (ulong)(((long)pvVar2 - (long)pvVar1 >> 3) * -0x5555555555555555)) {
    uVar4 = 1;
    lVar5 = 0x20;
    do {
      if (*(long *)((long)pvVar1 + lVar5 + -8) !=
          *(long *)((long)&(pvVar1->super__Vector_base<Link,_std::allocator<Link>_>)._M_impl.
                           super__Vector_impl_data + lVar5)) {
        local_78 = uVar4;
        local_70 = &local_68;
        std::
        _Hashtable<long,long,std::allocator<long>,std::__detail::_Identity,std::equal_to<long>,std::hash<long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_insert<long,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<long,false>>>>
                  ((_Hashtable<long,long,std::allocator<long>,std::__detail::_Identity,std::equal_to<long>,std::hash<long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)&local_68,&local_78,&local_70);
        pvVar1 = (this->links).
                 super__Vector_base<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pvVar2 = (this->links).
                 super__Vector_base<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
      uVar4 = uVar4 + 1;
      uVar3 = ((long)pvVar2 - (long)pvVar1 >> 3) * -0x5555555555555555;
      lVar5 = lVar5 + 0x18;
    } while (uVar4 <= uVar3 && uVar3 - uVar4 != 0);
  }
  std::
  _Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::_Hashtable(&__return_storage_ptr__->_M_h,&local_68,&local_68);
  std::
  _Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_68);
  return __return_storage_ptr__;
}

Assistant:

std::unordered_set<sgNodeID_t> DistanceGraph::get_connected_nodes() const {
    std::unordered_set<sgNodeID_t> r;
    for (auto n=1;n<links.size();++n) if (!links[n].empty()) r.insert(n);
    return std::move(r);
}